

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_Curve * __thiscall ON_Hatch::LoopCurve3d(ON_Hatch *this,int index)

{
  int iVar1;
  ON_HatchLoop **ppOVar2;
  ON_Curve *pOVar3;
  undefined4 extraout_var;
  undefined1 local_a0 [8];
  ON_Xform xf;
  ON_Curve *pC;
  int count;
  int index_local;
  ON_Hatch *this_local;
  
  iVar1 = ON_SimpleArray<ON_HatchLoop_*>::Count(&this->m_loops);
  xf.m_xform[3][3] = 0.0;
  if ((-1 < index) && (index < iVar1)) {
    ppOVar2 = ON_SimpleArray<ON_HatchLoop_*>::operator[](&this->m_loops,index);
    pOVar3 = ON_HatchLoop::Curve(*ppOVar2);
    if (pOVar3 != (ON_Curve *)0x0) {
      ppOVar2 = ON_SimpleArray<ON_HatchLoop_*>::operator[](&this->m_loops,index);
      pOVar3 = ON_HatchLoop::Curve(*ppOVar2);
      iVar1 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      xf.m_xform[3][3] = (double)CONCAT44(extraout_var,iVar1);
      if ((long *)xf.m_xform[3][3] != (long *)0x0) {
        (**(code **)(*(long *)xf.m_xform[3][3] + 0x140))(xf.m_xform[3][3],3);
        ON_Xform::ON_Xform((ON_Xform *)local_a0);
        ON_Xform::Rotation((ON_Xform *)local_a0,&ON_xy_plane,&this->m_plane);
        (**(code **)(*(long *)xf.m_xform[3][3] + 0xe0))(xf.m_xform[3][3],local_a0);
      }
    }
  }
  return (ON_Curve *)xf.m_xform[3][3];
}

Assistant:

ON_Curve* ON_Hatch::LoopCurve3d( int index) const
{
  int count = m_loops.Count();
  ON_Curve* pC = nullptr;

  if( index >= 0 && index < count)
  {
    if( m_loops[index]->Curve())
    {
      pC = m_loops[index]->Curve()->DuplicateCurve();
      if( pC)
      {
        pC->ChangeDimension( 3);

        ON_Xform xf;
        xf.Rotation( ON_xy_plane, m_plane);

        pC->Transform( xf);
      }
    }
  }
  return pC;
}